

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O0

void test_evp_value_init(void)

{
  bool bVar1;
  reference_type piVar2;
  storage_type *psVar3;
  reference_type __lhs;
  storage_type *psVar4;
  string local_d8 [32];
  undefined1 local_b8 [8];
  opt_t_conflict oE_1;
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  opt_t_conflict o1_1;
  opt_t_conflict o__1;
  compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<int>,_ak_toolbox::compact_optional_ns::default_tag>
  local_18;
  value_type local_14;
  opt_t oE;
  compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<int>,_ak_toolbox::compact_optional_ns::default_tag>
  local_c;
  opt_t o1;
  opt_t o_;
  
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<int>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&local_c);
  local_14 = 1;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<int>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&oE,&local_14);
  o__1.
  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .super_type._28_4_ = 0;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<int>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&local_18,
                     (value_type *)
                     &o__1.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .super_type.field_0x1c);
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>::has_value
                    (&local_c.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>
                    );
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!o_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x99,"void test_evp_value_init()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>::has_value
                    (&oE.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>
                    );
  if (!bVar1) {
    __assert_fail("o1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x9a,"void test_evp_value_init()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>::has_value
                    (&local_18.
                      super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>
                    );
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!oE.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x9b,"void test_evp_value_init()");
  }
  piVar2 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>::value
                     (&oE.
                       super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>
                     );
  if (*piVar2 != 1) {
    __assert_fail("o1.value() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x9d,"void test_evp_value_init()");
  }
  psVar3 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>::
           unsafe_raw_value(&local_c.
                             super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>
                           );
  if (*psVar3 != 0) {
    __assert_fail("o_.unsafe_raw_value() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x9f,"void test_evp_value_init()");
  }
  psVar3 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>::
           unsafe_raw_value(&oE.
                             super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>
                           );
  if (*psVar3 != 1) {
    __assert_fail("o1.unsafe_raw_value() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xa0,"void test_evp_value_init()");
  }
  psVar3 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>::
           unsafe_raw_value(&local_18.
                             super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<int>_>
                           );
  if (*psVar3 != 0) {
    __assert_fail("oE.unsafe_raw_value() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xa1,"void test_evp_value_init()");
  }
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional((compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ak_toolbox::compact_optional_ns::default_tag>
                      *)&o1_1.
                         super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .super_type.field_0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"one",&local_81);
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional((compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ak_toolbox::compact_optional_ns::default_tag>
                      *)local_60,(value_type *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::string(local_d8);
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional((compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ak_toolbox::compact_optional_ns::default_tag>
                      *)local_b8,(value_type *)local_d8);
  std::__cxx11::string::~string(local_d8);
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::has_value((compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&o1_1.
                          super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .super_type.field_0x18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!o_.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xa7,"void test_evp_value_init()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::has_value((compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_60);
  if (!bVar1) {
    __assert_fail("o1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xa8,"void test_evp_value_init()");
  }
  bVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::has_value((compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_b8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!oE.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xa9,"void test_evp_value_init()");
  }
  __lhs = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::value((compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_60);
  bVar1 = std::operator==(__lhs,"one");
  if (!bVar1) {
    __assert_fail("o1.value() == \"one\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xab,"void test_evp_value_init()");
  }
  psVar4 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::unsafe_raw_value((compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)&o1_1.
                                  super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .super_type.field_0x18);
  bVar1 = std::operator==(psVar4,"");
  if (!bVar1) {
    __assert_fail("o_.unsafe_raw_value() == \"\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xad,"void test_evp_value_init()");
  }
  psVar4 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::unsafe_raw_value((compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_60);
  bVar1 = std::operator==(psVar4,"one");
  if (!bVar1) {
    __assert_fail("o1.unsafe_raw_value() == \"one\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xae,"void test_evp_value_init()");
  }
  psVar4 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::unsafe_raw_value((compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_b8);
  bVar1 = std::operator==(psVar4,"");
  if (!bVar1) {
    __assert_fail("oE.unsafe_raw_value() == \"\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0xaf,"void test_evp_value_init()");
  }
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ak_toolbox::compact_optional_ns::default_tag>
  ::~compact_optional((compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ak_toolbox::compact_optional_ns::default_tag>
                       *)local_b8);
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ak_toolbox::compact_optional_ns::default_tag>
  ::~compact_optional((compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ak_toolbox::compact_optional_ns::default_tag>
                       *)local_60);
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ak_toolbox::compact_optional_ns::default_tag>
  ::~compact_optional((compact_optional<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_ak_toolbox::compact_optional_ns::default_tag>
                       *)&o1_1.
                          super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_value_init<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .super_type.field_0x18);
  return;
}

Assistant:

void test_evp_value_init()
{
  {
    typedef compact_optional<evp_value_init<int>> opt_t;
    opt_t o_, o1 (1), oE(0);
    
    assert (!o_.has_value());
    assert ( o1.has_value());
    assert (!oE.has_value());
    
    assert (o1.value() == 1);
    
    assert (o_.unsafe_raw_value() == 0);
    assert (o1.unsafe_raw_value() == 1);
    assert (oE.unsafe_raw_value() == 0);
  }
  {
    typedef compact_optional<evp_value_init<std::string>> opt_t;
    opt_t o_, o1 (std::string("one")), oE ((std::string()));
    
    assert (!o_.has_value());
    assert ( o1.has_value());
    assert (!oE.has_value());
    
    assert (o1.value() == "one");
    
    assert (o_.unsafe_raw_value() == "");
    assert (o1.unsafe_raw_value() == "one");
    assert (oE.unsafe_raw_value() == "");
  }
}